

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void __thiscall
Assimp::LWOImporter::ComputeNormals
          (LWOImporter *this,aiMesh *mesh,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *smoothingGroups,Surface *surface)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  undefined1 auVar4 [16];
  double dVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  aiVector3D *paVar9;
  aiFace *paVar10;
  aiVector3t<float> *paVar11;
  pointer paVar12;
  reference puVar13;
  reference v1;
  reference v2;
  ai_real pRadius;
  float fVar14;
  aiVector3t<float> aVar15;
  reference rVar16;
  aiVector3t<float> *local_2b0;
  reference local_290;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_280;
  uint *local_278;
  reference local_270;
  aiVector3D *v_1;
  uint *local_260;
  undefined1 local_254 [8];
  aiVector3D vNormals_1;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_240;
  const_iterator end_2;
  const_iterator a_1;
  uint idx_1;
  uint *endIdx_1;
  uint *beginIdx_1;
  aiFace *face_3;
  allocator<bool> local_1f2;
  bool local_1f1;
  undefined1 local_1f0 [8];
  vector<bool,_std::allocator<bool>_> vertexDone;
  aiVector3D *v;
  uint *local_1b8;
  undefined1 local_1ac [8];
  aiVector3D vNormals;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_198;
  const_iterator end_1;
  const_iterator a;
  uint idx;
  uint *endIdx;
  uint *beginIdx;
  aiFace *face_2;
  undefined1 local_158 [4];
  float fLimit;
  vector<unsigned_int,_std::allocator<unsigned_int>_> poResult;
  uint tt;
  uint i_1;
  aiFace *face_1;
  const_iterator it;
  SGSpatialSort sSort;
  float posEpsilon;
  uint i;
  aiVector3t<float> local_d0;
  aiVector3t<float> local_c0;
  aiVector3t<float> local_b0;
  aiVector3t<float> local_a0;
  undefined8 local_94;
  aiVector3D vNor;
  aiVector3D *pV3;
  aiVector3D *pV2;
  aiVector3D *pV1;
  aiFace *face;
  aiFace *end;
  aiFace *begin;
  undefined1 local_48 [8];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> faceNormals;
  aiVector3D *out;
  Surface *surface_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *smoothingGroups_local;
  aiMesh *mesh_local;
  LWOImporter *this_local;
  
  uVar7 = CONCAT44(0,mesh->mNumVertices);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar7;
  uVar8 = SUB168(auVar4 * ZEXT816(0xc),0);
  if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
    uVar8 = 0xffffffffffffffff;
  }
  paVar9 = (aiVector3D *)operator_new__(uVar8);
  if (uVar7 != 0) {
    local_2b0 = paVar9;
    do {
      aiVector3t<float>::aiVector3t(local_2b0);
      local_2b0 = local_2b0 + 1;
    } while (local_2b0 != paVar9 + uVar7);
  }
  mesh->mNormals = paVar9;
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_48);
  if ((surface->mMaximumSmoothAngle != 0.0) || (NAN(surface->mMaximumSmoothAngle))) {
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
              ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_48,
               (ulong)mesh->mNumVertices);
    faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                   ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_48,0);
  }
  else {
    faceNormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = mesh->mNormals;
  }
  paVar10 = mesh->mFaces + mesh->mNumFaces;
  for (end = mesh->mFaces; end != paVar10; end = end + 1) {
    if (2 < end->mNumIndices) {
      paVar9 = mesh->mVertices;
      uVar1 = *end->mIndices;
      vNor._4_8_ = mesh->mVertices + end->mIndices[end->mNumIndices - 1];
      aVar15 = ::operator-(mesh->mVertices + end->mIndices[1],paVar9 + uVar1);
      local_c0.z = aVar15.z;
      local_c0._0_8_ = aVar15._0_8_;
      local_b0._0_8_ = local_c0._0_8_;
      local_b0.z = local_c0.z;
      aVar15 = ::operator-((aiVector3t<float> *)vNor._4_8_,paVar9 + uVar1);
      local_d0.z = aVar15.z;
      local_d0._0_8_ = aVar15._0_8_;
      aVar15 = operator^(&local_b0,&local_d0);
      local_a0.z = aVar15.z;
      local_a0._0_8_ = aVar15._0_8_;
      paVar11 = aiVector3t<float>::Normalize(&local_a0);
      local_94._0_4_ = paVar11->x;
      local_94._4_4_ = paVar11->y;
      vNor.x = paVar11->z;
      for (posEpsilon = 0.0; (uint)posEpsilon < end->mNumIndices;
          posEpsilon = (float)((int)posEpsilon + 1)) {
        paVar12 = faceNormals.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage + end->mIndices[(uint)posEpsilon];
        paVar12->x = (float)(undefined4)local_94;
        paVar12->y = (float)local_94._4_4_;
        paVar12->z = vNor.x;
      }
    }
  }
  if ((surface->mMaximumSmoothAngle != 0.0) || (NAN(surface->mMaximumSmoothAngle))) {
    pRadius = ComputePositionEpsilon(mesh);
    SGSpatialSort::SGSpatialSort((SGSpatialSort *)&it);
    face_1 = (aiFace *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(smoothingGroups);
    end = mesh->mFaces;
    while (end != paVar10) {
      for (poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < end->mNumIndices;
          poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        uVar1 = end->mIndices
                [poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_];
        paVar9 = mesh->mVertices;
        poResult.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = uVar1;
        puVar13 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&face_1);
        SGSpatialSort::Add((SGSpatialSort *)&it,paVar9 + uVar1,uVar1,*puVar13);
      }
      end = end + 1;
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    *)&face_1);
    }
    SGSpatialSort::Prepare((SGSpatialSort *)&it);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158,0x14);
    if ((3.0 < surface->mMaximumSmoothAngle || surface->mMaximumSmoothAngle == 3.0) ||
       ((this->configSpeedFlag & 1U) != 0)) {
      uVar1 = mesh->mNumVertices;
      local_1f1 = false;
      std::allocator<bool>::allocator(&local_1f2);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_1f0,(ulong)uVar1,&local_1f1,&local_1f2
                );
      std::allocator<bool>::~allocator(&local_1f2);
      end = mesh->mFaces;
      face_1 = (aiFace *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(smoothingGroups);
      while (end != paVar10) {
        puVar3 = end->mIndices;
        uVar1 = end->mNumIndices;
        for (endIdx_1 = end->mIndices; endIdx_1 != puVar3 + uVar1; endIdx_1 = endIdx_1 + 1) {
          uVar2 = *endIdx_1;
          rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)local_1f0,(ulong)uVar2);
          a_1._M_current = (uint *)rVar16._M_p;
          bVar6 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&a_1);
          if (!bVar6) {
            paVar9 = mesh->mVertices;
            puVar13 = __gnu_cxx::
                      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                   *)&face_1);
            SGSpatialSort::FindPositions
                      ((SGSpatialSort *)&it,paVar9 + uVar2,*puVar13,pRadius,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158,true);
            __gnu_cxx::
            __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::__normal_iterator(&end_2);
            vNormals_1._4_8_ =
                 std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
            __gnu_cxx::
            __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ::__normal_iterator<unsigned_int*>
                      ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        *)&local_240,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&vNormals_1.y);
            aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_254);
            v_1 = (aiVector3D *)
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
            __gnu_cxx::
            __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ::__normal_iterator<unsigned_int*>
                      ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        *)&local_260,
                       (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)&v_1);
            end_2._M_current = local_260;
            while( true ) {
              bVar6 = __gnu_cxx::operator!=(&end_2,&local_240);
              if (!bVar6) break;
              puVar13 = __gnu_cxx::
                        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&end_2);
              local_270 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::
                          operator[]((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                      *)local_48,(ulong)*puVar13);
              aiVector3t<float>::operator+=((aiVector3t<float> *)local_254,local_270);
              __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&end_2);
            }
            aiVector3t<float>::Normalize((aiVector3t<float> *)local_254);
            local_280._M_current =
                 (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158
                                   );
            __gnu_cxx::
            __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ::__normal_iterator<unsigned_int*>
                      ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                        *)&local_278,&local_280);
            end_2._M_current = local_278;
            while( true ) {
              bVar6 = __gnu_cxx::operator!=(&end_2,&local_240);
              if (!bVar6) break;
              paVar9 = mesh->mNormals;
              puVar13 = __gnu_cxx::
                        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&end_2);
              uVar2 = *puVar13;
              paVar9[uVar2].z = vNormals_1.x;
              paVar9 = paVar9 + uVar2;
              paVar9->x = (float)local_254._0_4_;
              paVar9->y = (float)local_254._4_4_;
              puVar13 = __gnu_cxx::
                        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&end_2);
              rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)local_1f0,(ulong)*puVar13);
              local_290 = rVar16;
              std::_Bit_reference::operator=(&local_290,true);
              __gnu_cxx::
              __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              ::operator++(&end_2);
            }
          }
        }
        end = end + 1;
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&face_1);
      }
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_1f0);
    }
    else {
      dVar5 = std::cos((double)(ulong)(uint)surface->mMaximumSmoothAngle);
      end = mesh->mFaces;
      face_1 = (aiFace *)
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(smoothingGroups);
      while (end != paVar10) {
        puVar3 = end->mIndices;
        uVar1 = end->mNumIndices;
        for (endIdx = end->mIndices; endIdx != puVar3 + uVar1; endIdx = endIdx + 1) {
          uVar2 = *endIdx;
          paVar9 = mesh->mVertices;
          puVar13 = __gnu_cxx::
                    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)&face_1);
          SGSpatialSort::FindPositions
                    ((SGSpatialSort *)&it,paVar9 + uVar2,*puVar13,pRadius,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158,true);
          __gnu_cxx::
          __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::__normal_iterator(&end_1);
          vNormals._4_8_ =
               std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
          __gnu_cxx::
          __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          ::__normal_iterator<unsigned_int*>
                    ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      *)&local_198,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&vNormals.y);
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_1ac);
          v = (aiVector3D *)
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
          __gnu_cxx::
          __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
          ::__normal_iterator<unsigned_int*>
                    ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                      *)&local_1b8,
                     (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&v);
          end_1._M_current = local_1b8;
          while (bVar6 = __gnu_cxx::operator!=(&end_1,&local_198), bVar6) {
            puVar13 = __gnu_cxx::
                      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator*(&end_1);
            v1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            local_48,(ulong)*puVar13);
            vertexDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage = (_Bit_pointer)v1;
            v2 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                           ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
                            local_48,(ulong)uVar2);
            fVar14 = ::operator*(v1,v2);
            if (SUB84(dVar5,0) <= fVar14) {
              aiVector3t<float>::operator+=
                        ((aiVector3t<float> *)local_1ac,
                         (aiVector3t<float> *)
                         vertexDone.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage);
            }
            __gnu_cxx::
            __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
            ::operator++(&end_1);
          }
          paVar11 = aiVector3t<float>::Normalize((aiVector3t<float> *)local_1ac);
          paVar9 = mesh->mNormals + uVar2;
          fVar14 = paVar11->y;
          paVar9->x = paVar11->x;
          paVar9->y = fVar14;
          paVar9->z = paVar11->z;
        }
        end = end + 1;
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&face_1);
      }
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
    SGSpatialSort::~SGSpatialSort((SGSpatialSort *)&it);
  }
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~vector
            ((vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)local_48);
  return;
}

Assistant:

void LWOImporter::ComputeNormals(aiMesh* mesh, const std::vector<unsigned int>& smoothingGroups,
    const LWO::Surface& surface)
{
    // Allocate output storage
    mesh->mNormals = new aiVector3D[mesh->mNumVertices];

    // First generate per-face normals
    aiVector3D* out;
    std::vector<aiVector3D> faceNormals;

    // ... in some cases that's already enough
    if (!surface.mMaximumSmoothAngle)
        out = mesh->mNormals;
    else    {
        faceNormals.resize(mesh->mNumVertices);
        out = &faceNormals[0];
    }

    aiFace* begin = mesh->mFaces, *const end = mesh->mFaces+mesh->mNumFaces;
    for (; begin != end; ++begin)   {
        aiFace& face = *begin;

        if(face.mNumIndices < 3) {
            continue;
        }

        // LWO doc: "the normal is defined as the cross product of the first and last edges"
        aiVector3D* pV1 = mesh->mVertices + face.mIndices[0];
        aiVector3D* pV2 = mesh->mVertices + face.mIndices[1];
        aiVector3D* pV3 = mesh->mVertices + face.mIndices[face.mNumIndices-1];

        aiVector3D vNor = ((*pV2 - *pV1) ^(*pV3 - *pV1)).Normalize();
        for (unsigned int i = 0; i < face.mNumIndices;++i)
            out[face.mIndices[i]] = vNor;
    }
    if (!surface.mMaximumSmoothAngle)return;
    const float posEpsilon = ComputePositionEpsilon(mesh);

    // Now generate the spatial sort tree
    SGSpatialSort sSort;
    std::vector<unsigned int>::const_iterator it = smoothingGroups.begin();
    for( begin =  mesh->mFaces; begin != end; ++begin, ++it)
    {
        aiFace& face = *begin;
        for (unsigned int i = 0; i < face.mNumIndices;++i)
        {
            unsigned int tt = face.mIndices[i];
            sSort.Add(mesh->mVertices[tt],tt,*it);
        }
    }
    // Sort everything - this takes O(nlogn) time
    sSort.Prepare();
    std::vector<unsigned int> poResult;
    poResult.reserve(20);

    // Generate vertex normals. We have O(logn) for the binary lookup, which we need
    // for n elements, thus the EXPECTED complexity is O(nlogn)
    if (surface.mMaximumSmoothAngle < 3.f && !configSpeedFlag)  {
        const float fLimit = std::cos(surface.mMaximumSmoothAngle);

        for( begin =  mesh->mFaces, it = smoothingGroups.begin(); begin != end; ++begin, ++it)  {
            const aiFace& face = *begin;
            unsigned int* beginIdx = face.mIndices, *const endIdx = face.mIndices+face.mNumIndices;
            for (; beginIdx != endIdx; ++beginIdx)
            {
                unsigned int idx = *beginIdx;
                sSort.FindPositions(mesh->mVertices[idx],*it,posEpsilon,poResult,true);
                std::vector<unsigned int>::const_iterator a, end = poResult.end();

                aiVector3D vNormals;
                for (a =  poResult.begin();a != end;++a)    {
                    const aiVector3D& v = faceNormals[*a];
                    if (v * faceNormals[idx] < fLimit)
                        continue;
                    vNormals += v;
                }
                mesh->mNormals[idx] = vNormals.Normalize();
            }
        }
    }
     // faster code path in case there is no smooth angle
    else    {
        std::vector<bool> vertexDone(mesh->mNumVertices,false);
        for( begin =  mesh->mFaces, it = smoothingGroups.begin(); begin != end; ++begin, ++it)  {
            const aiFace& face = *begin;
            unsigned int* beginIdx = face.mIndices, *const endIdx = face.mIndices+face.mNumIndices;
            for (; beginIdx != endIdx; ++beginIdx)
            {
                unsigned int idx = *beginIdx;
                if (vertexDone[idx])
                    continue;
                sSort.FindPositions(mesh->mVertices[idx],*it,posEpsilon,poResult,true);
                std::vector<unsigned int>::const_iterator a, end = poResult.end();

                aiVector3D vNormals;
                for (a =  poResult.begin();a != end;++a)    {
                    const aiVector3D& v = faceNormals[*a];
                    vNormals += v;
                }
                vNormals.Normalize();
                for (a =  poResult.begin();a != end;++a)    {
                    mesh->mNormals[*a] = vNormals;
                    vertexDone[*a] = true;
                }
            }
        }
    }
}